

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRConstant *c;
  SPIRType *type;
  undefined1 *extraout_RAX;
  undefined1 *puVar6;
  long lVar7;
  string name;
  LoopLock LStack_a8;
  ulong local_a0;
  size_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_98 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_a8);
  }
  else {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    local_a0 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeConstant) {
        c = Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar1);
        if (c->specialization == false) {
          type = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(c->super_IVariant).field_0xc);
          if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
            if (local_98 == 1) {
              bVar5 = Compiler::is_scalar((Compiler *)this,type);
              if (!bVar5) {
                bVar5 = Compiler::is_vector((Compiler *)this,type);
                if (!bVar5) goto LAB_00261fa9;
              }
            }
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_70,this,(ulong)(c->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                      (&local_90,this,type,local_70,0);
            CompilerGLSL::constant_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,c);
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_90,
                       (char (*) [4])0x2f7937,&local_50,(char (*) [2])0x2ddbde);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            puVar6 = local_60;
            if (local_70[0] != puVar6) {
              operator_delete(local_70[0]);
              puVar6 = extraout_RAX;
            }
            local_a0 = CONCAT71((int7)((ulong)puVar6 >> 8),1);
          }
        }
      }
LAB_00261fa9:
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
    ParsedIR::LoopLock::~LoopLock(&LStack_a8);
    if ((local_a0 & 1) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
    }
  }
  return;
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (!type.array.empty() && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}